

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O3

void Gia_ManPrintObjClasses(Gia_Man_t *p)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint *__s;
  int *__s_00;
  void *__s_01;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint *puVar18;
  ulong uVar19;
  uint uVar20;
  size_t __size;
  int local_94;
  
  pVVar6 = p->vObjClasses;
  if (pVVar6 == (Vec_Int_t *)0x0) {
    return;
  }
  uVar2 = pVVar6->nSize;
  if (0 < (int)uVar2) {
    uVar3 = *pVVar6->pArray;
    if ((-2 < (long)(int)uVar3) && (uVar13 = uVar3 + 1, uVar13 < uVar2)) {
      if (pVVar6->pArray[uVar13] != uVar2) {
        __assert_fail("Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absDup.c"
                      ,0x17a,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
      }
      __size = (ulong)uVar13 << 2;
      __s = (uint *)malloc(__size);
      __s_00 = (int *)malloc(__size);
      iVar12 = (((int)uVar3 >> 5) + 1) - (uint)((uVar3 & 0x1f) == 0);
      uVar2 = p->nObjs;
      iVar14 = uVar2 * iVar12;
      iVar9 = 0x10;
      if (0xe < iVar14 - 1U) {
        iVar9 = iVar14;
      }
      if (iVar9 == 0) {
        __s_01 = (void *)0x0;
      }
      else {
        __s_01 = malloc((long)iVar9 << 2);
      }
      memset(__s_01,0,(long)iVar14 << 2);
      iVar9 = 0x1f;
      if (uVar2 - 1 != 0) {
        for (; uVar2 - 1 >> iVar9 == 0; iVar9 = iVar9 + -1) {
        }
      }
      uVar13 = iVar9 + 0x21;
      if (uVar2 < 2) {
        uVar13 = uVar2;
      }
      local_94 = -1;
      uVar10 = ~(-1 << ((byte)uVar13 & 0x1f));
      if ((int)uVar10 < (int)uVar2) {
        __assert_fail("Gia_ManObjNum(p) <= nObjMask",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absDup.c"
                      ,0x183,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
      }
      puts("Frame   Core   F0   F1   F2   F3 ...");
      if (0 < (int)uVar3) {
        lVar17 = 1;
        uVar15 = 0;
        do {
          uVar1 = uVar15 + 1;
          uVar2 = pVVar6->nSize;
          if (((long)(int)uVar2 <= (long)uVar1) || ((ulong)uVar2 <= uVar15 + 2)) goto LAB_0055b836;
          piVar7 = pVVar6->pArray;
          uVar4 = piVar7[uVar1];
          uVar19 = (ulong)uVar4;
          local_94 = piVar7[uVar15 + 2];
          memset(__s,0,__size);
          memset(__s_00,0,__size);
          if ((int)uVar4 < local_94) {
            puVar18 = (uint *)(piVar7 + uVar19);
            do {
              if (((int)uVar4 < 0) || ((int)uVar2 <= (int)uVar19)) goto LAB_0055b836;
              uVar11 = (int)*puVar18 >> ((byte)uVar13 & 0x1f);
              uVar20 = (*puVar18 & uVar10) * iVar12;
              if (((int)uVar20 < 0) || (iVar14 <= (int)uVar20)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
              }
              uVar5 = *(uint *)((long)__s_01 + (long)((int)uVar11 >> 5) * 4 + (ulong)uVar20 * 4);
              if ((uVar5 >> (uVar11 & 0x1f) & 1) == 0) {
                *(uint *)((long)__s_01 + (long)((int)uVar11 >> 5) * 4 + (ulong)uVar20 * 4) =
                     uVar5 | 1 << ((byte)uVar11 & 0x1f);
                __s_00[(long)(int)uVar11 + 1] = __s_00[(long)(int)uVar11 + 1] + 1;
                *__s_00 = *__s_00 + 1;
              }
              __s[(long)(int)uVar11 + 1] = __s[(long)(int)uVar11 + 1] + 1;
              uVar11 = *__s + 1;
              *__s = uVar11;
              uVar20 = (int)uVar19 + 1;
              uVar19 = (ulong)uVar20;
              puVar18 = puVar18 + 1;
            } while ((int)uVar20 < local_94);
          }
          else {
            uVar11 = *__s;
          }
          if (uVar11 != local_94 - uVar4) {
            __assert_fail("pCountAll[0] == (iStop - iStart)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absDup.c"
                          ,0x19a,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
          }
          printf("%3d :",uVar15 & 0xffffffff);
          printf("%7d",(ulong)uVar11);
          if (uVar15 < 10) {
            lVar16 = 0;
            do {
              printf("%5d");
              lVar16 = lVar16 + 1;
            } while (lVar17 != lVar16);
          }
          else {
            lVar16 = 0;
            do {
              lVar8 = lVar16 + 1;
              lVar16 = lVar16 + 1;
              printf("%5d",(ulong)__s[lVar8]);
            } while (lVar16 != 4);
            printf("  ...");
            lVar16 = 0;
            do {
              printf("%5d");
              lVar16 = lVar16 + 1;
            } while (lVar16 != 5);
          }
          putchar(10);
          lVar17 = lVar17 + 1;
          uVar15 = uVar1;
        } while (uVar1 != (long)(int)uVar3);
      }
      if (local_94 != pVVar6->nSize) {
        __assert_fail("iStop == Vec_IntSize(vAbs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absDup.c"
                      ,0x1b1,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
      }
      if (__s_01 != (void *)0x0) {
        free(__s_01);
      }
      if (__s != (uint *)0x0) {
        free(__s);
      }
      if (__s_00 == (int *)0x0) {
        return;
      }
      free(__s_00);
      return;
    }
  }
LAB_0055b836:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManPrintObjClasses( Gia_Man_t * p )
{
    Vec_Int_t * vSeens;  // objects seen so far
    Vec_Int_t * vAbs = p->vObjClasses;
    int i, k, Entry, iStart, iStop = -1, nFrames;
    int nObjBits, nObjMask, iObj, iFrame, nWords;
    unsigned * pInfo;
	int * pCountAll, * pCountUni;
    if ( vAbs == NULL )
        return;
    nFrames = Vec_IntEntry( vAbs, 0 );
    assert( Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs) );
    pCountAll = ABC_ALLOC( int, nFrames + 1 );
    pCountUni = ABC_ALLOC( int, nFrames + 1 );
    // start storage for seen objects
    nWords = Abc_BitWordNum( nFrames );
    vSeens = Vec_IntStart( Gia_ManObjNum(p) * nWords );
    // get the bitmasks
    nObjBits = Abc_Base2Log( Gia_ManObjNum(p) );
    nObjMask = (1 << nObjBits) - 1;
    assert( Gia_ManObjNum(p) <= nObjMask );
    // print info about frames
    printf( "Frame   Core   F0   F1   F2   F3 ...\n" );
    for ( i = 0; i < nFrames; i++ )
    {
        iStart = Vec_IntEntry( vAbs, i+1 );
        iStop  = Vec_IntEntry( vAbs, i+2 );
        memset( pCountAll, 0, sizeof(int) * (nFrames + 1) );
        memset( pCountUni, 0, sizeof(int) * (nFrames + 1) );
        Vec_IntForEachEntryStartStop( vAbs, Entry, k, iStart, iStop )
        {
            iObj   = (Entry &  nObjMask);
            iFrame = (Entry >> nObjBits);
            pInfo  = (unsigned *)Vec_IntEntryP( vSeens, nWords * iObj );
            if ( Abc_InfoHasBit(pInfo, iFrame) == 0 )
            {
                Abc_InfoSetBit( pInfo, iFrame );
                pCountUni[iFrame+1]++;
                pCountUni[0]++;
            }
            pCountAll[iFrame+1]++;
            pCountAll[0]++;
        }
        assert( pCountAll[0] == (iStop - iStart) );
//        printf( "%5d%5d  ", pCountAll[0], pCountUni[0] ); 
        printf( "%3d :", i );
        printf( "%7d", pCountAll[0] ); 
        if ( i >= 10 )
        {
            for ( k = 0; k < 4; k++ )
                printf( "%5d", pCountAll[k+1] ); 
            printf( "  ..." );
            for ( k = i-4; k <= i; k++ )
                printf( "%5d", pCountAll[k+1] ); 
        }
        else
        {
            for ( k = 0; k <= i; k++ )
                if ( k <= i )
                    printf( "%5d", pCountAll[k+1] ); 
        }
//        for ( k = 0; k < nFrames; k++ )
//            if ( k <= i )
//                printf( "%5d", pCountAll[k+1] ); 
        printf( "\n" );
    }
    assert( iStop == Vec_IntSize(vAbs) );
    Vec_IntFree( vSeens );
    ABC_FREE( pCountAll );
    ABC_FREE( pCountUni );
}